

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O3

void ldifusreg(void)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  char *pcVar5;
  Symbol *pSVar6;
  List *pLVar7;
  Symbol *pSVar8;
  uint uVar9;
  ulong uVar10;
  Item *item;
  Item *pIVar11;
  
  pLVar7 = ldifuslist->next;
  if (pLVar7 != ldifuslist) {
    uVar9 = 0;
    do {
      pIVar11 = (pLVar7->next->element).itm;
      pIVar1 = pLVar7->next->next;
      pIVar2 = (pIVar1->element).itm;
      pIVar1 = pIVar1->next;
      item = (pIVar1->element).itm;
      pIVar1 = pIVar1->next;
      pIVar3 = (pIVar1->element).itm;
      pIVar1 = pIVar1->next;
      pIVar4 = (pIVar1->element).itm;
      pIVar1 = pIVar1->next;
      pcVar5 = (pIVar1->element).str;
      uVar9 = uVar9 + 1;
      sprintf(buf,
              "static void* _difspace%d;\nextern double nrn_nernst_coef();\nstatic double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n   *_pdvol = "
              ,(ulong)uVar9,(ulong)uVar9);
      lappendstr(procfunc,buf);
      for (; item != pIVar3; item = item->next) {
        lappenditem(procfunc,item);
      }
      if (*pcVar5 == '\0') {
        builtin_strncpy(buf,"; *_pdfcdc=0.;\n",0x10);
      }
      else {
        sprintf(buf,";\n if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n",pIVar4);
      }
      lappendstr(procfunc,buf);
      lappendstr(procfunc,"  return");
      for (; pIVar11 != pIVar2; pIVar11 = pIVar11->next) {
        lappenditem(procfunc,pIVar11);
      }
      lappendstr(procfunc,";\n}\n");
      pLVar7 = pIVar1->next;
    } while (pLVar7 != ldifuslist);
  }
  lappendstr(procfunc,"static void _difusfunc(_f, _nt) void(*_f)(); NrnThread* _nt; {int _i;\n");
  pLVar7 = ldifuslist->next;
  if (pLVar7 != ldifuslist) {
    uVar10 = 1;
    do {
      pSVar6 = (pLVar7->element).sym;
      pIVar11 = pLVar7->next->next->next->next->next->next;
      if ((pSVar6->subtype & 0x20) == 0) {
        sprintf(buf," (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ",uVar10,uVar10);
      }
      else {
        sprintf(buf," for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ",
                (ulong)(uint)pSVar6->araydim,uVar10,uVar10);
      }
      lappendstr(procfunc,buf);
      sprintf(buf,"D%s",pSVar6->name);
      pSVar8 = lookup(buf);
      if (pSVar8 == (Symbol *)0x0) {
        __assert_fail("d",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                      ,0x6cd,"void ldifusreg()");
      }
      if ((pSVar6->nrntype & 0x1000) == 0) {
        uVar9 = pSVar6->varnum;
      }
      else {
        uVar9 = ~pSVar6->ioncount_;
      }
      sprintf(buf,"%d, %d",(ulong)uVar9,(ulong)(uint)pSVar8->varnum);
      lappendstr(procfunc,buf);
      lappendstr(procfunc,", _nt);\n");
      pLVar7 = pIVar11->next;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (pLVar7 != ldifuslist);
  }
  lappendstr(procfunc,"}\n");
  return;
}

Assistant:

void ldifusreg() {
	Item* q, *qdexp, *qb1, *qvexp, *qb2, *q1;
	char* cfindex, *dfdcur;
	Symbol* s, *d;
	int n;
	
	/* ldifuslist format: series of symbol qdexp qb1 svexp qb2
			indexforflux dflux/dconc */
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;
sprintf(buf, "static void* _difspace%d;\nextern double nrn_nernst_coef();\n\
static double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n  \
 *_pdvol = ", n, n);
		lappendstr(procfunc, buf);
		for (q1 = qvexp; q1 != qb2; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		if (dfdcur[0]) {
			sprintf(buf, ";\n\
 if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n", cfindex, dfdcur);
 		}else{
 			sprintf(buf, "; *_pdfcdc=0.;\n");
 		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, "  return");
		for (q1 = qdexp; q1 != qb1; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		lappendstr(procfunc, ";\n}\n");
	}
#if MAC
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void *_f; NrnThread* _nt; {int _i;\n");
#else
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void(*_f)(); NrnThread* _nt; {int _i;\n");
#endif
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;

		if (s->subtype & ARRAY) {
#if MAC
sprintf(buf, " for (_i=0; _i < %d; ++_i) mac_difusfunc(_f, _mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#else
sprintf(buf, " for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#endif
		}else{
#if MAC
sprintf(buf, " mac_difusfunc(_f,_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#else
sprintf(buf, " (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#endif
		}
		lappendstr(procfunc, buf);

		sprintf(buf, "D%s", s->name);
		d = lookup(buf);
		assert(d);
		if (s->nrntype & IONCONC) {
			sprintf(buf, "%d, %d",
			  - (s->ioncount_ + 1), d->varnum);
		}else{
			sprintf(buf, "%d, %d", s->varnum, d->varnum);
		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, ", _nt);\n");
	}
	lappendstr(procfunc, "}\n");
}